

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O3

MediaPlayer2 *
media_player2_proxy_new_sync
          (GDBusConnection *connection,GDBusProxyFlags flags,gchar *name,gchar *object_path,
          GCancellable *cancellable,GError **error)

{
  GType GVar1;
  long lVar2;
  MediaPlayer2 *pMVar3;
  
  GVar1 = media_player2_proxy_get_type();
  lVar2 = g_initable_new(GVar1,cancellable,error,"g-flags",flags,"g-name",name,"g-connection",
                         connection,"g-object-path",object_path,"g-interface-name",
                         "org.mpris.MediaPlayer2",0);
  if (lVar2 != 0) {
    GVar1 = media_player2_get_type();
    pMVar3 = (MediaPlayer2 *)g_type_check_instance_cast(lVar2,GVar1);
    return pMVar3;
  }
  return (MediaPlayer2 *)0x0;
}

Assistant:

MediaPlayer2 *
media_player2_proxy_new_sync (
    GDBusConnection     *connection,
    GDBusProxyFlags      flags,
    const gchar         *name,
    const gchar         *object_path,
    GCancellable        *cancellable,
    GError             **error)
{
  GInitable *ret;
  ret = g_initable_new (TYPE_MEDIA_PLAYER2_PROXY, cancellable, error, "g-flags", flags, "g-name", name, "g-connection", connection, "g-object-path", object_path, "g-interface-name", "org.mpris.MediaPlayer2", NULL);
  if (ret != NULL)
    return MEDIA_PLAYER2 (ret);
  else
    return NULL;
}